

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O2

bool __thiscall r_exec::HLPBindingMap::need_binding(HLPBindingMap *this,Code *pattern)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  short sVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ushort uVar6;
  Atom p_atom;
  undefined4 local_2c;
  
  (*(pattern->super__Object)._vptr__Object[4])(pattern,0);
  sVar4 = r_code::Atom::asOpcode();
  if (sVar4 == Opcodes::Ont) {
    return false;
  }
  (*(pattern->super__Object)._vptr__Object[4])(pattern,0);
  sVar4 = r_code::Atom::asOpcode();
  if (sVar4 == Opcodes::Ent) {
    return false;
  }
  (*(pattern->super__Object)._vptr__Object[4])(pattern,0);
  sVar4 = r_code::Atom::asOpcode();
  if (sVar4 == Opcodes::Mdl) {
    return false;
  }
  (*(pattern->super__Object)._vptr__Object[4])(pattern,0);
  sVar4 = r_code::Atom::asOpcode();
  if (sVar4 == Opcodes::Cst) {
    return false;
  }
  uVar6 = 0;
  while (iVar5 = (*(pattern->super__Object)._vptr__Object[10])(pattern), uVar6 < (ushort)iVar5) {
    iVar5 = (*(pattern->super__Object)._vptr__Object[9])(pattern,(ulong)uVar6);
    bVar2 = need_binding(this,(Code *)CONCAT44(extraout_var,iVar5));
    uVar6 = uVar6 + 1;
    if (bVar2) {
      return true;
    }
  }
  uVar6 = 1;
  do {
    iVar5 = (*(pattern->super__Object)._vptr__Object[6])(pattern);
    bVar2 = uVar6 < (ushort)iVar5;
    if (!bVar2) {
      return bVar2;
    }
    iVar5 = (*(pattern->super__Object)._vptr__Object[4])(pattern,(ulong)uVar6);
    local_2c = *(undefined4 *)CONCAT44(extraout_var_00,iVar5);
    bVar3 = r_code::Atom::getDescriptor();
    if (bVar3 - 0xc6 < 2) {
      bVar3 = r_code::Atom::getAtomCount();
      uVar6 = uVar6 + bVar3;
LAB_001703c8:
      bVar1 = true;
    }
    else {
      if (bVar3 != 0x86) goto LAB_001703c8;
      bVar1 = false;
    }
    r_code::Atom::~Atom((Atom *)&local_2c);
    uVar6 = uVar6 + 1;
    if (!bVar1) {
      return bVar2;
    }
  } while( true );
}

Assistant:

bool HLPBindingMap::need_binding(Code *pattern) const
{
    if (pattern->code(0).asOpcode() == Opcodes::Ont ||
        pattern->code(0).asOpcode() == Opcodes::Ent ||
        pattern->code(0).asOpcode() == Opcodes::Mdl ||
        pattern->code(0).asOpcode() == Opcodes::Cst) {
        return false;
    }

    for (uint16_t i = 0; i < pattern->references_size(); ++i) {
        if (need_binding(pattern->get_reference(i))) {
            return true;
        }
    }

    for (uint16_t i = 1; i < pattern->code_size(); ++i) {
        Atom p_atom = pattern->code(i);

        switch (p_atom.getDescriptor()) {
        case Atom::VL_PTR:
            return true;

        case Atom::TIMESTAMP:
        case Atom::STRING:
            i += p_atom.getAtomCount();
            break;

        default:
            break;
        }
    }

    return false;
}